

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O3

void av1_cdef_mse_calc_block
               (CdefSearchCtx *cdef_search_ctx,aom_internal_error_info *error_info,int fbr,int fbc,
               int sb_count)

{
  undefined8 *puVar1;
  uint64_t *puVar2;
  byte bVar3;
  byte bVar4;
  YV12_BUFFER_CONFIG *pYVar5;
  CommonModeInfoParams *mi_params;
  uint8_t *puVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  short sVar15;
  short sVar16;
  CdefSearchCtx *pCVar17;
  int iVar18;
  uint cdef_count;
  int iVar19;
  uint64_t uVar20;
  int64_t iVar21;
  BLOCK_SIZE bs;
  sbyte sVar22;
  int iVar23;
  undefined1 *puVar24;
  int *piVar25;
  uint16_t *puVar26;
  int mi_row;
  uint uVar27;
  uint uVar28;
  long lVar29;
  int mi_col;
  uint uVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  int iVar43;
  undefined1 auVar42 [16];
  long lVar45;
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar73;
  int iVar74;
  int iVar81;
  undefined1 auVar75 [16];
  int iVar82;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar90 [16];
  int dirinit;
  int ref_stride [3];
  cdef_list dlist [1024];
  int var [16] [16];
  int dir [16] [16];
  uint16_t inbuf [19008];
  uint8_t tmp_dst8 [16384];
  int iStack_125f0;
  int iStack_125ec;
  int iStack_125e8;
  int iStack_125e4;
  ulong uStack_125e0;
  ulong uStack_125d8;
  ulong uStack_125d0;
  CdefSearchCtx *pCStack_125c8;
  long lStack_125c0;
  long lStack_125b8;
  long lStack_125b0;
  int iStack_125a8;
  int iStack_125a4;
  int iStack_125a0;
  int iStack_1259c;
  int iStack_12598;
  int iStack_12594;
  CommonModeInfoParams *pCStack_12590;
  uint8_t *puStack_12588;
  long lStack_12580;
  ulong uStack_12578;
  uint8_t *puStack_12570;
  ulong uStack_12568;
  ulong uStack_12560;
  int aiStack_12554 [3];
  BLOCK_SIZE (*paaBStack_12548) [2] [2];
  uint16_t *puStack_12540;
  ulong uStack_12538;
  ulong uStack_12530;
  macroblockd_plane *pmStack_12528;
  ulong uStack_12520;
  ulong uStack_12518;
  uint16_t *puStack_12510;
  BLOCK_SIZE *pBStack_12508;
  uint8_t *apuStack_12500 [4];
  cdef_list acStack_124e0 [1024];
  int aiStack_11ce0 [256];
  int aiStack_118e0 [256];
  undefined8 auStack_114e0 [3];
  undefined1 auStack_114c2 [258];
  undefined8 auStack_113c0 [36];
  undefined8 auStack_112a0 [2];
  uint16_t auStack_11290 [4];
  undefined8 auStack_11288 [4677];
  uint16_t local_8060 [16408];
  
  pYVar5 = cdef_search_ctx->ref;
  mi_params = cdef_search_ctx->mi_params;
  uStack_125d0 = (ulong)(uint)cdef_search_ctx->coeff_shift;
  memset(aiStack_118e0,0,0x400);
  memset(aiStack_11ce0,0,0x400);
  mi_col = fbc * 0x10;
  iVar23 = mi_params->mi_cols + fbc * -0x10;
  iStack_125ec = 0x10;
  if (iVar23 < 0x10) {
    iStack_125ec = iVar23;
  }
  mi_row = fbr * 0x10;
  iVar18 = mi_params->mi_rows + fbr * -0x10;
  iStack_125e8 = 0x10;
  if (iVar18 < 0x10) {
    iStack_125e8 = iVar18;
  }
  apuStack_12500[0] = (pYVar5->field_5).field_0.y_buffer;
  apuStack_12500[1] = (pYVar5->field_5).field_0.u_buffer;
  apuStack_12500[2] = (pYVar5->field_5).field_0.v_buffer;
  aiStack_12554[0] = (pYVar5->field_4).field_0.y_stride;
  aiStack_12554[1] = (pYVar5->field_4).field_0.uv_stride;
  bs = mi_params->mi_grid_base[mi_params->mi_stride * mi_row + mi_col]->bsize;
  if ((byte)(bs - BLOCK_64X128) < 3) {
    iVar74 = 1;
    if ((~bs & 0xe) == 0) {
      iStack_125ec = 0x20;
      if (iVar23 < 0x20) {
        iStack_125ec = iVar23;
      }
      iVar33 = 1;
      iVar23 = 2;
      iVar74 = 2;
      if ((~bs & 0xd) != 0) goto LAB_001fee2f;
    }
    iVar23 = iVar74;
    iStack_125e8 = 0x20;
    if (iVar18 < 0x20) {
      iStack_125e8 = iVar18;
    }
    iVar33 = 2;
  }
  else {
    iVar33 = 1;
    bs = BLOCK_64X64;
    iVar23 = 1;
  }
LAB_001fee2f:
  pCStack_12590 = mi_params;
  aiStack_12554[2] = aiStack_12554[1];
  cdef_count = av1_cdef_compute_sb_list(mi_params,mi_row,mi_col,acStack_124e0,bs);
  iStack_125a4 = cdef_search_ctx->nvfb;
  iStack_125a8 = cdef_search_ctx->nhfb;
  iStack_125f0 = 0;
  if (cdef_search_ctx->num_planes < 1) {
    lVar36 = (long)sb_count;
  }
  else {
    iStack_1259c = iVar23 + fbc;
    iStack_125a0 = iVar33 + fbr;
    uVar27 = (uint)(fbr != 0) * 2;
    uStack_12520 = (ulong)uVar27;
    uVar30 = (uint)(fbc != 0) * 8;
    uStack_12518 = (ulong)uVar30;
    bVar38 = iStack_125a0 == iStack_125a4;
    bVar39 = iStack_1259c == iStack_125a8;
    pmStack_12528 = cdef_search_ctx->plane;
    bVar40 = fbr == 0;
    uStack_12530 = (ulong)(uVar27 + (uint)!bVar38 * 2);
    iVar23 = -0x120;
    if (bVar40) {
      iVar23 = 0;
    }
    uStack_12538 = (ulong)(uVar30 + (uint)!bVar39 * 8);
    puStack_12540 = auStack_11290 + (int)(iVar23 + (uint)(fbc != 0) * -8);
    lVar36 = (long)sb_count;
    paaBStack_12548 = av1_ss_size_lookup + bs;
    uStack_12578 = 0;
    pCStack_125c8 = cdef_search_ctx;
    iStack_12598 = fbc;
    lStack_12580 = lVar36;
    do {
      iVar33 = iStack_12598;
      iVar18 = iStack_125e8;
      bVar3 = (byte)pCStack_125c8->mi_wide_l2[uStack_12578];
      uVar30 = iStack_125ec << (bVar3 & 0x1f);
      bVar4 = (byte)pCStack_125c8->mi_high_l2[uStack_12578];
      bVar7 = bVar4 & 0x1f;
      uVar27 = iStack_125e8 << bVar7;
      uVar32 = mi_row << (bVar4 & 0x1f);
      uStack_125d8 = (ulong)uVar32;
      uVar28 = mi_col << (bVar3 & 0x1f);
      uStack_125e0 = (ulong)uVar28;
      lStack_125b0 = (long)pmStack_12528[uStack_12578].subsampling_x;
      lStack_125b8 = (long)pmStack_12528[uStack_12578].subsampling_y;
      puStack_12570 = pmStack_12528[uStack_12578].dst.buf;
      iVar23 = pmStack_12528[uStack_12578].dst.stride;
      (*pCStack_125c8->copy_fn)
                (puStack_12540,0x90,puStack_12570,uVar32 - (int)uStack_12520,
                 uVar28 - (int)uStack_12518,iVar23,(int)uStack_12530 + uVar27,
                 (int)uStack_12538 + uVar30);
      if (((fbc == 0 || bVar40) || bVar39) || bVar38) {
        if (iStack_125a0 == iStack_125a4) {
          lVar29 = (ulong)uVar30 - 1;
          auVar41._8_4_ = (int)lVar29;
          auVar41._0_8_ = lVar29;
          auVar41._12_4_ = (int)((ulong)lVar29 >> 0x20);
          puVar24 = auStack_114c2 + (long)(int)(uVar27 * 0x90 + 0x120) * 2;
          auVar41 = auVar41 ^ _DAT_004d0ab0;
          lVar29 = 0;
          do {
            if (0 < (int)uVar30) {
              lVar31 = 0;
              auVar63 = _DAT_004d0aa0;
              auVar90 = _DAT_004d0a90;
              auVar67 = _DAT_004d2680;
              auVar68 = _DAT_004d2670;
              do {
                auVar49 = auVar63 ^ _DAT_004d0ab0;
                iVar74 = auVar41._0_4_;
                iVar73 = -(uint)(iVar74 < auVar49._0_4_);
                iVar19 = auVar41._4_4_;
                auVar50._4_4_ = -(uint)(iVar19 < auVar49._4_4_);
                iVar82 = auVar41._8_4_;
                iVar81 = -(uint)(iVar82 < auVar49._8_4_);
                iVar43 = auVar41._12_4_;
                auVar50._12_4_ = -(uint)(iVar43 < auVar49._12_4_);
                auVar60._4_4_ = iVar73;
                auVar60._0_4_ = iVar73;
                auVar60._8_4_ = iVar81;
                auVar60._12_4_ = iVar81;
                auVar83 = pshuflw(in_XMM8,auVar60,0xe8);
                auVar52._4_4_ = -(uint)(auVar49._4_4_ == iVar19);
                auVar52._12_4_ = -(uint)(auVar49._12_4_ == iVar43);
                auVar52._0_4_ = auVar52._4_4_;
                auVar52._8_4_ = auVar52._12_4_;
                auVar87 = pshuflw(in_XMM9,auVar52,0xe8);
                auVar50._0_4_ = auVar50._4_4_;
                auVar50._8_4_ = auVar50._12_4_;
                auVar84 = pshuflw(auVar83,auVar50,0xe8);
                auVar49._8_4_ = 0xffffffff;
                auVar49._0_8_ = 0xffffffffffffffff;
                auVar49._12_4_ = 0xffffffff;
                auVar49 = (auVar84 | auVar87 & auVar83) ^ auVar49;
                auVar49 = packssdw(auVar49,auVar49);
                if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -0xe) = 0x4000;
                }
                auVar50 = auVar52 & auVar60 | auVar50;
                auVar49 = packssdw(auVar50,auVar50);
                auVar84._8_4_ = 0xffffffff;
                auVar84._0_8_ = 0xffffffffffffffff;
                auVar84._12_4_ = 0xffffffff;
                auVar49 = packssdw(auVar49 ^ auVar84,auVar49 ^ auVar84);
                if ((auVar49._0_4_ >> 0x10 & 1) != 0) {
                  *(undefined2 *)(puVar24 + lVar31 + -0xc) = 0x4000;
                }
                auVar49 = auVar90 ^ _DAT_004d0ab0;
                iVar73 = -(uint)(iVar74 < auVar49._0_4_);
                auVar75._4_4_ = -(uint)(iVar19 < auVar49._4_4_);
                iVar81 = -(uint)(iVar82 < auVar49._8_4_);
                auVar75._12_4_ = -(uint)(iVar43 < auVar49._12_4_);
                auVar51._4_4_ = iVar73;
                auVar51._0_4_ = iVar73;
                auVar51._8_4_ = iVar81;
                auVar51._12_4_ = iVar81;
                auVar59._4_4_ = -(uint)(auVar49._4_4_ == iVar19);
                auVar59._12_4_ = -(uint)(auVar49._12_4_ == iVar43);
                auVar59._0_4_ = auVar59._4_4_;
                auVar59._8_4_ = auVar59._12_4_;
                auVar75._0_4_ = auVar75._4_4_;
                auVar75._8_4_ = auVar75._12_4_;
                auVar49 = auVar59 & auVar51 | auVar75;
                auVar49 = packssdw(auVar49,auVar49);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                auVar49 = packssdw(auVar49 ^ auVar8,auVar49 ^ auVar8);
                if ((auVar49 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -10) = 0x4000;
                }
                auVar52 = pshufhw(auVar51,auVar51,0x84);
                auVar60 = pshufhw(auVar59,auVar59,0x84);
                auVar50 = pshufhw(auVar52,auVar75,0x84);
                auVar53._8_4_ = 0xffffffff;
                auVar53._0_8_ = 0xffffffffffffffff;
                auVar53._12_4_ = 0xffffffff;
                auVar53 = (auVar50 | auVar60 & auVar52) ^ auVar53;
                auVar52 = packssdw(auVar53,auVar53);
                if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -8) = 0x4000;
                }
                auVar52 = auVar67 ^ _DAT_004d0ab0;
                iVar73 = -(uint)(iVar74 < auVar52._0_4_);
                auVar55._4_4_ = -(uint)(iVar19 < auVar52._4_4_);
                iVar81 = -(uint)(iVar82 < auVar52._8_4_);
                auVar55._12_4_ = -(uint)(iVar43 < auVar52._12_4_);
                auVar61._4_4_ = iVar73;
                auVar61._0_4_ = iVar73;
                auVar61._8_4_ = iVar81;
                auVar61._12_4_ = iVar81;
                auVar49 = pshuflw(auVar49,auVar61,0xe8);
                auVar54._4_4_ = -(uint)(auVar52._4_4_ == iVar19);
                auVar54._12_4_ = -(uint)(auVar52._12_4_ == iVar43);
                auVar54._0_4_ = auVar54._4_4_;
                auVar54._8_4_ = auVar54._12_4_;
                in_XMM9 = pshuflw(auVar87 & auVar83,auVar54,0xe8);
                in_XMM9 = in_XMM9 & auVar49;
                auVar55._0_4_ = auVar55._4_4_;
                auVar55._8_4_ = auVar55._12_4_;
                auVar49 = pshuflw(auVar49,auVar55,0xe8);
                auVar83._8_4_ = 0xffffffff;
                auVar83._0_8_ = 0xffffffffffffffff;
                auVar83._12_4_ = 0xffffffff;
                auVar83 = (auVar49 | in_XMM9) ^ auVar83;
                auVar49 = packssdw(auVar83,auVar83);
                if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -6) = 0x4000;
                }
                auVar55 = auVar54 & auVar61 | auVar55;
                auVar49 = packssdw(auVar55,auVar55);
                auVar87._8_4_ = 0xffffffff;
                auVar87._0_8_ = 0xffffffffffffffff;
                auVar87._12_4_ = 0xffffffff;
                auVar49 = packssdw(auVar49 ^ auVar87,auVar49 ^ auVar87);
                if ((auVar49 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -4) = 0x4000;
                }
                auVar49 = auVar68 ^ _DAT_004d0ab0;
                iVar74 = -(uint)(iVar74 < auVar49._0_4_);
                auVar76._4_4_ = -(uint)(iVar19 < auVar49._4_4_);
                iVar82 = -(uint)(iVar82 < auVar49._8_4_);
                auVar76._12_4_ = -(uint)(iVar43 < auVar49._12_4_);
                auVar56._4_4_ = iVar74;
                auVar56._0_4_ = iVar74;
                auVar56._8_4_ = iVar82;
                auVar56._12_4_ = iVar82;
                auVar62._4_4_ = -(uint)(auVar49._4_4_ == iVar19);
                auVar62._12_4_ = -(uint)(auVar49._12_4_ == iVar43);
                auVar62._0_4_ = auVar62._4_4_;
                auVar62._8_4_ = auVar62._12_4_;
                auVar76._0_4_ = auVar76._4_4_;
                auVar76._8_4_ = auVar76._12_4_;
                auVar49 = auVar62 & auVar56 | auVar76;
                auVar49 = packssdw(auVar49,auVar49);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar49 ^ auVar9,auVar49 ^ auVar9);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -2) = 0x4000;
                }
                auVar49 = pshufhw(auVar56,auVar56,0x84);
                auVar50 = pshufhw(auVar62,auVar62,0x84);
                auVar52 = pshufhw(auVar49,auVar76,0x84);
                auVar57._8_4_ = 0xffffffff;
                auVar57._0_8_ = 0xffffffffffffffff;
                auVar57._12_4_ = 0xffffffff;
                auVar57 = (auVar52 | auVar50 & auVar49) ^ auVar57;
                auVar49 = packssdw(auVar57,auVar57);
                if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31) = 0x4000;
                }
                lVar45 = auVar63._8_8_;
                auVar63._0_8_ = auVar63._0_8_ + 8;
                auVar63._8_8_ = lVar45 + 8;
                lVar45 = auVar90._8_8_;
                auVar90._0_8_ = auVar90._0_8_ + 8;
                auVar90._8_8_ = lVar45 + 8;
                lVar45 = auVar67._8_8_;
                auVar67._0_8_ = auVar67._0_8_ + 8;
                auVar67._8_8_ = lVar45 + 8;
                lVar45 = auVar68._8_8_;
                auVar68._0_8_ = auVar68._0_8_ + 8;
                auVar68._8_8_ = lVar45 + 8;
                lVar31 = lVar31 + 0x10;
              } while ((ulong)(uVar30 + 7 >> 3) << 4 != lVar31);
            }
            lVar29 = lVar29 + 1;
            puVar24 = puVar24 + 0x120;
          } while (lVar29 != 2);
LAB_001ff368:
          lVar31 = (long)(int)(uVar27 * 0x90 + 0x120);
          lVar29 = lVar31 * 2;
          *(undefined8 *)((long)auStack_114e0 + lVar29) = 0x4000400040004000;
          *(undefined8 *)((long)auStack_114e0 + lVar29 + 8) = 0x4000400040004000;
          lVar31 = lVar31 * 2;
          *(undefined8 *)((long)auStack_113c0 + lVar31) = 0x4000400040004000;
          *(undefined8 *)((long)auStack_113c0 + lVar31 + 8) = 0x4000400040004000;
        }
        else if (iVar33 == 0) goto LAB_001ff368;
        if (bVar38 || bVar39) {
          lVar31 = (long)(int)(uVar27 * 0x90 + uVar30 + 0x120);
          lVar29 = lVar31 * 2;
          *(undefined8 *)((long)auStack_114e0 + lVar29 + 0x10) = 0x4000400040004000;
          *(undefined8 *)(&stack0xfffffffffffeeb38 + lVar29) = 0x4000400040004000;
          lVar31 = lVar31 * 2;
          *(undefined8 *)((long)auStack_113c0 + lVar31 + 0x10) = 0x4000400040004000;
          *(undefined8 *)((long)auStack_113c0 + lVar31 + 0x18) = 0x4000400040004000;
        }
        if (fbr == 0) {
          lVar29 = (ulong)uVar30 - 1;
          auVar42._8_4_ = (int)lVar29;
          auVar42._0_8_ = lVar29;
          auVar42._12_4_ = (int)((ulong)lVar29 >> 0x20);
          puVar24 = auStack_114c2;
          lVar29 = 0;
          do {
            if (0 < (int)uVar30) {
              lVar31 = 0;
              auVar44 = _DAT_004d0aa0;
              auVar46 = _DAT_004d0a90;
              auVar47 = _DAT_004d2680;
              auVar48 = _DAT_004d2670;
              do {
                auVar41 = auVar42 ^ _DAT_004d0ab0;
                auVar63 = auVar44 ^ _DAT_004d0ab0;
                iVar74 = auVar41._0_4_;
                iVar73 = -(uint)(iVar74 < auVar63._0_4_);
                iVar19 = auVar41._4_4_;
                auVar65._4_4_ = -(uint)(iVar19 < auVar63._4_4_);
                iVar82 = auVar41._8_4_;
                iVar81 = -(uint)(iVar82 < auVar63._8_4_);
                iVar43 = auVar41._12_4_;
                auVar65._12_4_ = -(uint)(iVar43 < auVar63._12_4_);
                auVar77._4_4_ = iVar73;
                auVar77._0_4_ = iVar73;
                auVar77._8_4_ = iVar81;
                auVar77._12_4_ = iVar81;
                auVar41 = pshuflw(in_XMM9,auVar77,0xe8);
                auVar64._4_4_ = -(uint)(auVar63._4_4_ == iVar19);
                auVar64._12_4_ = -(uint)(auVar63._12_4_ == iVar43);
                auVar64._0_4_ = auVar64._4_4_;
                auVar64._8_4_ = auVar64._12_4_;
                auVar90 = pshuflw(in_XMM10,auVar64,0xe8);
                auVar65._0_4_ = auVar65._4_4_;
                auVar65._8_4_ = auVar65._12_4_;
                auVar63 = pshuflw(auVar41,auVar65,0xe8);
                auVar88._8_4_ = 0xffffffff;
                auVar88._0_8_ = 0xffffffffffffffff;
                auVar88._12_4_ = 0xffffffff;
                auVar88 = (auVar63 | auVar90 & auVar41) ^ auVar88;
                auVar63 = packssdw(auVar88,auVar88);
                if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -0xe) = 0x4000;
                }
                auVar65 = auVar64 & auVar77 | auVar65;
                auVar63 = packssdw(auVar65,auVar65);
                auVar10._8_4_ = 0xffffffff;
                auVar10._0_8_ = 0xffffffffffffffff;
                auVar10._12_4_ = 0xffffffff;
                auVar63 = packssdw(auVar63 ^ auVar10,auVar63 ^ auVar10);
                if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
                  *(undefined2 *)(puVar24 + lVar31 + -0xc) = 0x4000;
                }
                auVar63 = auVar46 ^ _DAT_004d0ab0;
                iVar73 = -(uint)(iVar74 < auVar63._0_4_);
                auVar85._4_4_ = -(uint)(iVar19 < auVar63._4_4_);
                iVar81 = -(uint)(iVar82 < auVar63._8_4_);
                auVar85._12_4_ = -(uint)(iVar43 < auVar63._12_4_);
                auVar66._4_4_ = iVar73;
                auVar66._0_4_ = iVar73;
                auVar66._8_4_ = iVar81;
                auVar66._12_4_ = iVar81;
                auVar78._4_4_ = -(uint)(auVar63._4_4_ == iVar19);
                auVar78._12_4_ = -(uint)(auVar63._12_4_ == iVar43);
                auVar78._0_4_ = auVar78._4_4_;
                auVar78._8_4_ = auVar78._12_4_;
                auVar85._0_4_ = auVar85._4_4_;
                auVar85._8_4_ = auVar85._12_4_;
                auVar63 = auVar78 & auVar66 | auVar85;
                auVar63 = packssdw(auVar63,auVar63);
                auVar11._8_4_ = 0xffffffff;
                auVar11._0_8_ = 0xffffffffffffffff;
                auVar11._12_4_ = 0xffffffff;
                auVar63 = packssdw(auVar63 ^ auVar11,auVar63 ^ auVar11);
                if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -10) = 0x4000;
                }
                auVar67 = pshufhw(auVar66,auVar66,0x84);
                auVar49 = pshufhw(auVar78,auVar78,0x84);
                auVar68 = pshufhw(auVar67,auVar85,0x84);
                auVar69._8_4_ = 0xffffffff;
                auVar69._0_8_ = 0xffffffffffffffff;
                auVar69._12_4_ = 0xffffffff;
                auVar69 = (auVar68 | auVar49 & auVar67) ^ auVar69;
                auVar67 = packssdw(auVar69,auVar69);
                if ((auVar67 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -8) = 0x4000;
                }
                auVar67 = auVar47 ^ _DAT_004d0ab0;
                iVar73 = -(uint)(iVar74 < auVar67._0_4_);
                auVar71._4_4_ = -(uint)(iVar19 < auVar67._4_4_);
                iVar81 = -(uint)(iVar82 < auVar67._8_4_);
                auVar71._12_4_ = -(uint)(iVar43 < auVar67._12_4_);
                auVar79._4_4_ = iVar73;
                auVar79._0_4_ = iVar73;
                auVar79._8_4_ = iVar81;
                auVar79._12_4_ = iVar81;
                auVar63 = pshuflw(auVar63,auVar79,0xe8);
                auVar70._4_4_ = -(uint)(auVar67._4_4_ == iVar19);
                auVar70._12_4_ = -(uint)(auVar67._12_4_ == iVar43);
                auVar70._0_4_ = auVar70._4_4_;
                auVar70._8_4_ = auVar70._12_4_;
                in_XMM10 = pshuflw(auVar90 & auVar41,auVar70,0xe8);
                in_XMM10 = in_XMM10 & auVar63;
                auVar71._0_4_ = auVar71._4_4_;
                auVar71._8_4_ = auVar71._12_4_;
                auVar41 = pshuflw(auVar63,auVar71,0xe8);
                auVar89._8_4_ = 0xffffffff;
                auVar89._0_8_ = 0xffffffffffffffff;
                auVar89._12_4_ = 0xffffffff;
                auVar89 = (auVar41 | in_XMM10) ^ auVar89;
                auVar41 = packssdw(auVar89,auVar89);
                if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -6) = 0x4000;
                }
                auVar71 = auVar70 & auVar79 | auVar71;
                auVar41 = packssdw(auVar71,auVar71);
                auVar12._8_4_ = 0xffffffff;
                auVar12._0_8_ = 0xffffffffffffffff;
                auVar12._12_4_ = 0xffffffff;
                auVar41 = packssdw(auVar41 ^ auVar12,auVar41 ^ auVar12);
                if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -4) = 0x4000;
                }
                auVar41 = auVar48 ^ _DAT_004d0ab0;
                auVar86._0_4_ = -(uint)(iVar74 < auVar41._0_4_);
                auVar86._4_4_ = -(uint)(iVar19 < auVar41._4_4_);
                auVar86._8_4_ = -(uint)(iVar82 < auVar41._8_4_);
                auVar86._12_4_ = -(uint)(iVar43 < auVar41._12_4_);
                auVar72._4_4_ = auVar86._0_4_;
                auVar72._0_4_ = auVar86._0_4_;
                auVar72._8_4_ = auVar86._8_4_;
                auVar72._12_4_ = auVar86._8_4_;
                iVar74 = -(uint)(auVar41._4_4_ == iVar19);
                iVar19 = -(uint)(auVar41._12_4_ == iVar43);
                auVar58._4_4_ = iVar74;
                auVar58._0_4_ = iVar74;
                auVar58._8_4_ = iVar19;
                auVar58._12_4_ = iVar19;
                auVar80._4_4_ = auVar86._4_4_;
                auVar80._0_4_ = auVar86._4_4_;
                auVar80._8_4_ = auVar86._12_4_;
                auVar80._12_4_ = auVar86._12_4_;
                in_XMM9 = auVar58 & auVar72 | auVar80;
                auVar41 = packssdw(auVar86,in_XMM9);
                auVar13._8_4_ = 0xffffffff;
                auVar13._0_8_ = 0xffffffffffffffff;
                auVar13._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar41 ^ auVar13,auVar41 ^ auVar13);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31 + -2) = 0x4000;
                }
                auVar63 = pshufhw(auVar72,auVar72,0x84);
                auVar41 = pshufhw(auVar58,auVar58,0x84);
                auVar90 = pshufhw(auVar63,auVar80,0x84);
                auVar14._8_4_ = 0xffffffff;
                auVar14._0_8_ = 0xffffffffffffffff;
                auVar14._12_4_ = 0xffffffff;
                auVar41 = packssdw(auVar41 & auVar63,(auVar90 | auVar41 & auVar63) ^ auVar14);
                if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(undefined2 *)(puVar24 + lVar31) = 0x4000;
                }
                lVar45 = auVar44._8_8_;
                auVar44._0_8_ = auVar44._0_8_ + 8;
                auVar44._8_8_ = lVar45 + 8;
                lVar45 = auVar46._8_8_;
                auVar46._0_8_ = auVar46._0_8_ + 8;
                auVar46._8_8_ = lVar45 + 8;
                lVar45 = auVar47._8_8_;
                auVar47._0_8_ = auVar47._0_8_ + 8;
                auVar47._8_8_ = lVar45 + 8;
                lVar45 = auVar48._8_8_;
                auVar48._0_8_ = auVar48._0_8_ + 8;
                auVar48._8_8_ = lVar45 + 8;
                lVar31 = lVar31 + 0x10;
              } while ((ulong)(uVar30 + 7 >> 3) << 4 != lVar31);
            }
            lVar29 = lVar29 + 1;
            puVar24 = puVar24 + 0x120;
          } while (lVar29 != 2);
LAB_001ff683:
          auStack_114e0[0] = 0x4000400040004000;
          auStack_114e0[1] = 0x4000400040004000;
          auStack_113c0[0] = 0x4000400040004000;
          auStack_113c0[1] = 0x4000400040004000;
        }
        else if (iVar33 == 0) goto LAB_001ff683;
        if (bVar40 || bVar39) {
          lVar29 = (long)(int)uVar30 * 2;
          *(undefined8 *)((long)auStack_114e0 + lVar29 + 0x10) = 0x4000400040004000;
          *(undefined8 *)(&stack0xfffffffffffeeb38 + lVar29) = 0x4000400040004000;
          lVar29 = (long)(int)uVar30 * 2;
          *(undefined8 *)((long)auStack_113c0 + lVar29 + 0x10) = 0x4000400040004000;
          *(undefined8 *)((long)auStack_113c0 + lVar29 + 0x18) = 0x4000400040004000;
        }
        if ((iVar33 == 0) && (0 < iVar18 << bVar7)) {
          lVar29 = 0;
          do {
            *(undefined8 *)((long)auStack_112a0 + lVar29) = 0x4000400040004000;
            *(undefined8 *)((long)auStack_112a0 + lVar29 + 8) = 0x4000400040004000;
            lVar29 = lVar29 + 0x120;
          } while ((ulong)uVar27 * 0x120 != lVar29);
        }
        if ((iStack_1259c == iStack_125a8) && (0 < iVar18 << bVar7)) {
          lVar29 = 0;
          do {
            puVar1 = (undefined8 *)((long)auStack_11290 + lVar29 + (long)(int)uVar30 * 2);
            *puVar1 = 0x4000400040004000;
            puVar1[1] = 0x4000400040004000;
            lVar29 = lVar29 + 0x120;
          } while ((ulong)uVar27 * 0x120 != lVar29);
        }
      }
      if (0 < pCStack_125c8->total_strengths) {
        puVar6 = apuStack_12500[uStack_12578];
        iVar18 = aiStack_12554[uStack_12578];
        uVar30 = 3 - (int)lStack_125b0;
        uStack_12568 = (ulong)uVar30;
        uVar27 = 3 - (int)lStack_125b8;
        uStack_12560 = (ulong)uVar27;
        pBStack_12508 = (*paaBStack_12548)[lStack_125b0] + lStack_125b8;
        iStack_12594 = uVar27 + uVar30;
        iStack_125e4 = 1 << ((byte)uVar27 & 0x1f);
        puStack_12588 = puVar6 + (iVar18 * (short)uStack_125d8 + (int)(short)uStack_125e0);
        puStack_12510 =
             (uint16_t *)(puStack_12570 + ((short)uStack_125d8 * iVar23 + (int)(short)uStack_125e0))
        ;
        lVar29 = 0;
        do {
          uVar35 = uStack_12578;
          pCVar17 = pCStack_125c8;
          uVar27 = pCStack_125c8->pick_method;
          bVar37 = uVar27 < 3;
          sVar22 = bVar37 + 1;
          if (uVar27 == 5) {
            sVar22 = 0;
          }
          uVar30 = bVar37 + 1 + (uint)bVar37;
          if (uVar27 == 5) {
            uVar30 = 0;
          }
          uVar28 = (uint)lVar29 >> sVar22;
          uVar30 = uVar30 & (uint)lVar29;
          switch(uVar27) {
          case 1:
            piVar25 = priconv_lvl1;
            goto LAB_001ff88c;
          case 2:
            piVar25 = priconv_lvl2;
LAB_001ff88c:
            uVar28 = piVar25[uVar28];
            break;
          case 3:
            piVar25 = priconv_lvl2;
            goto LAB_001ff870;
          case 4:
            piVar25 = priconv_lvl4;
LAB_001ff870:
            uVar28 = piVar25[uVar28];
            uVar30 = secconv_lvl3[uVar30];
            break;
          case 5:
            uVar28 = priconv_lvl5[uVar28];
            uVar30 = 0;
          }
          iVar33 = (int)uStack_12578;
          iVar74 = (int)uStack_125d0;
          if (pCStack_125c8->use_highbitdepth == false) {
            bVar3 = block_size_wide[*pBStack_12508];
            bVar4 = block_size_high[*pBStack_12508];
            if ((uint)bVar4 * (uint)bVar3 >> ((byte)iStack_12594 & 0x1f) == cdef_count) {
              puVar26 = puStack_12510;
              iVar19 = iVar23;
              if (uVar30 != 0 || uVar28 != 0) {
                if (uVar30 == 3) {
                  uVar30 = 4;
                }
                av1_cdef_filter_fb((uint8_t *)local_8060,(uint16_t *)0x0,0x80,auStack_11290,
                                   pCStack_125c8->xdec[uStack_12578],
                                   pCStack_125c8->ydec[uStack_12578],(int (*) [16])aiStack_118e0,
                                   &iStack_125f0,(int (*) [16])aiStack_11ce0,iVar33,acStack_124e0,
                                   cdef_count,uVar28,uVar30,pCStack_125c8->damping,iVar74);
                puVar26 = local_8060;
                iVar19 = 0x80;
              }
              uVar20 = (*aom_sse)(puStack_12588,iVar18,(uint8_t *)puVar26,iVar19,(uint)bVar3,
                                  (uint)bVar4);
            }
            else if (uVar30 == 0 && uVar28 == 0) {
              if ((int)cdef_count < 1) {
                uVar20 = 0;
              }
              else {
                uVar20 = 0;
                uVar35 = 0;
                do {
                  iVar33 = (int)uVar35;
                  bVar3 = acStack_124e0[uVar35].by;
                  bVar4 = acStack_124e0[uVar35].bx;
                  iVar74 = 1;
                  if ((((int)lStack_125b0 == (int)lStack_125b8) &&
                      (((uVar27 = iVar33 + 3, (int)cdef_count <= (int)uVar27 ||
                        (bVar3 != acStack_124e0[uVar27].by)) ||
                       (iVar74 = 4, bVar4 + 3 != (uint)acStack_124e0[uVar27].bx)))) &&
                     (((uVar27 = iVar33 + 1, (int)cdef_count <= (int)uVar27 ||
                       (bVar3 != acStack_124e0[uVar27].by)) ||
                      (iVar74 = 2, bVar4 + 1 != (uint)acStack_124e0[uVar27].bx)))) {
                    iVar74 = 1;
                  }
                  iVar19 = (int)(short)(((ushort)bVar3 << ((byte)uStack_12560 & 0x1f)) +
                                       (short)uStack_125d8);
                  iVar82 = (int)(short)(((ushort)bVar4 << ((byte)uStack_12568 & 0x1f)) +
                                       (short)uStack_125e0);
                  iVar21 = (*aom_sse)(puVar6 + (iVar19 * iVar18 + iVar82),iVar18,
                                      puStack_12570 + (iVar19 * iVar23 + iVar82),iVar23,
                                      iVar74 << ((byte)uStack_12568 & 0x1f),iStack_125e4);
                  uVar20 = uVar20 + iVar21;
                  uVar35 = (ulong)(uint)(iVar33 + iVar74);
                } while (iVar33 + iVar74 < (int)cdef_count);
              }
            }
            else {
              if (uVar30 == 3) {
                uVar30 = 4;
              }
              lStack_125c0 = lVar29;
              av1_cdef_filter_fb((uint8_t *)local_8060,(uint16_t *)0x0,0x80,auStack_11290,
                                 pCStack_125c8->xdec[uStack_12578],pCStack_125c8->ydec[uStack_12578]
                                 ,(int (*) [16])aiStack_118e0,&iStack_125f0,
                                 (int (*) [16])aiStack_11ce0,iVar33,acStack_124e0,cdef_count,uVar28,
                                 uVar30,pCStack_125c8->damping,iVar74);
              uVar35 = uStack_12568;
              uVar20 = 0;
              lVar29 = lStack_125c0;
              if (0 < (int)cdef_count) {
                uVar20 = 0;
                uVar34 = 0;
                do {
                  iVar33 = (int)uVar34;
                  bVar3 = acStack_124e0[uVar34].by;
                  bVar4 = acStack_124e0[uVar34].bx;
                  sVar15 = (ushort)bVar3 << ((byte)uStack_12560 & 0x1f);
                  sVar16 = (ushort)bVar4 << ((byte)uVar35 & 0x1f);
                  iVar74 = 1;
                  if (((int)lStack_125b0 == (int)lStack_125b8) &&
                     ((((uVar27 = iVar33 + 3, (int)cdef_count <= (int)uVar27 ||
                        (bVar3 != acStack_124e0[uVar27].by)) ||
                       (iVar74 = 4, bVar4 + 3 != (uint)acStack_124e0[uVar27].bx)) &&
                      (((uVar27 = iVar33 + 1, (int)cdef_count <= (int)uVar27 ||
                        (bVar3 != acStack_124e0[uVar27].by)) ||
                       (iVar74 = 2, bVar4 + 1 != (uint)acStack_124e0[uVar27].bx)))))) {
                    iVar74 = 1;
                  }
                  iVar21 = (*aom_sse)(puVar6 + ((int)(short)(sVar16 + (short)uStack_125e0) +
                                               (short)((short)uStack_125d8 + sVar15) * iVar18),
                                      iVar18,(uint8_t *)
                                             ((long)local_8060 + (long)((int)sVar16 + sVar15 * 0x80)
                                             ),0x80,iVar74 << ((byte)uVar35 & 0x1f),iStack_125e4);
                  uVar20 = uVar20 + iVar21;
                  uVar34 = (ulong)(uint)(iVar33 + iVar74);
                  lVar29 = lStack_125c0;
                } while (iVar33 + iVar74 < (int)cdef_count);
              }
            }
          }
          else {
            if (uVar30 == 3) {
              uVar30 = 4;
            }
            lStack_125c0 = lVar29;
            av1_cdef_filter_fb((uint8_t *)0x0,local_8060,0x90,auStack_11290,
                               pCStack_125c8->xdec[uStack_12578],pCStack_125c8->ydec[uStack_12578],
                               (int (*) [16])aiStack_118e0,&iStack_125f0,(int (*) [16])aiStack_11ce0
                               ,iVar33,acStack_124e0,cdef_count,uVar28,uVar30,pCStack_125c8->damping
                               ,iVar74);
            lVar29 = lStack_125c0;
            uVar20 = (*pCVar17->compute_cdef_dist_fn)
                               (puVar6,iVar18,local_8060,acStack_124e0,cdef_count,
                                (BLOCK_SIZE)pCVar17->bsize[uVar35],iVar74,(int)uStack_125d8,
                                (int)uStack_125e0);
          }
          if (uStack_12578 < 2) {
            pCStack_125c8->mse[uStack_12578][lStack_12580][lVar29] = uVar20;
          }
          else {
            puVar2 = pCStack_125c8->mse[1][lStack_12580] + lVar29;
            *puVar2 = *puVar2 + uVar20;
          }
          lVar29 = lVar29 + 1;
          lVar36 = lStack_12580;
        } while (lVar29 < pCStack_125c8->total_strengths);
      }
      uStack_12578 = uStack_12578 + 1;
      cdef_search_ctx = pCStack_125c8;
    } while ((long)uStack_12578 < (long)pCStack_125c8->num_planes);
  }
  cdef_search_ctx->sb_index[lVar36] = mi_row * pCStack_12590->mi_stride + mi_col;
  return;
}

Assistant:

void av1_cdef_mse_calc_block(CdefSearchCtx *cdef_search_ctx,
                             struct aom_internal_error_info *error_info,
                             int fbr, int fbc, int sb_count) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  const CommonModeInfoParams *const mi_params = cdef_search_ctx->mi_params;
  const YV12_BUFFER_CONFIG *ref = cdef_search_ctx->ref;
  const int coeff_shift = cdef_search_ctx->coeff_shift;
  const int *mi_wide_l2 = cdef_search_ctx->mi_wide_l2;
  const int *mi_high_l2 = cdef_search_ctx->mi_high_l2;

  // Declare and initialize the temporary buffers.
  DECLARE_ALIGNED(32, uint16_t, inbuf[CDEF_INBUF_SIZE]);
  cdef_list dlist[MI_SIZE_128X128 * MI_SIZE_128X128];
  int dir[CDEF_NBLOCKS][CDEF_NBLOCKS] = { { 0 } };
  int var[CDEF_NBLOCKS][CDEF_NBLOCKS] = { { 0 } };
  uint16_t *const in = inbuf + CDEF_VBORDER * CDEF_BSTRIDE + CDEF_HBORDER;
  int nhb = AOMMIN(MI_SIZE_64X64, mi_params->mi_cols - MI_SIZE_64X64 * fbc);
  int nvb = AOMMIN(MI_SIZE_64X64, mi_params->mi_rows - MI_SIZE_64X64 * fbr);
  int hb_step = 1, vb_step = 1;
  BLOCK_SIZE bs;

  const MB_MODE_INFO *const mbmi =
      mi_params->mi_grid_base[MI_SIZE_64X64 * fbr * mi_params->mi_stride +
                              MI_SIZE_64X64 * fbc];

  uint8_t *ref_buffer[MAX_MB_PLANE] = { ref->y_buffer, ref->u_buffer,
                                        ref->v_buffer };
  int ref_stride[MAX_MB_PLANE] = { ref->y_stride, ref->uv_stride,
                                   ref->uv_stride };

  if (mbmi->bsize == BLOCK_128X128 || mbmi->bsize == BLOCK_128X64 ||
      mbmi->bsize == BLOCK_64X128) {
    bs = mbmi->bsize;
    if (bs == BLOCK_128X128 || bs == BLOCK_128X64) {
      nhb = AOMMIN(MI_SIZE_128X128, mi_params->mi_cols - MI_SIZE_64X64 * fbc);
      hb_step = 2;
    }
    if (bs == BLOCK_128X128 || bs == BLOCK_64X128) {
      nvb = AOMMIN(MI_SIZE_128X128, mi_params->mi_rows - MI_SIZE_64X64 * fbr);
      vb_step = 2;
    }
  } else {
    bs = BLOCK_64X64;
  }
  // Get number of 8x8 blocks which are not skip. Cdef processing happens for
  // 8x8 blocks which are not skip.
  const int cdef_count = av1_cdef_compute_sb_list(
      mi_params, fbr * MI_SIZE_64X64, fbc * MI_SIZE_64X64, dlist, bs);
  const bool is_fb_on_frm_left_boundary = (fbc == 0);
  const bool is_fb_on_frm_right_boundary =
      (fbc + hb_step == cdef_search_ctx->nhfb);
  const bool is_fb_on_frm_top_boundary = (fbr == 0);
  const bool is_fb_on_frm_bottom_boundary =
      (fbr + vb_step == cdef_search_ctx->nvfb);
  const int yoff = CDEF_VBORDER * (!is_fb_on_frm_top_boundary);
  const int xoff = CDEF_HBORDER * (!is_fb_on_frm_left_boundary);
  int dirinit = 0;
  for (int pli = 0; pli < cdef_search_ctx->num_planes; pli++) {
    /* We avoid filtering the pixels for which some of the pixels to
    average are outside the frame. We could change the filter instead,
    but it would add special cases for any future vectorization. */
    const int hfilt_size = (nhb << mi_wide_l2[pli]);
    const int vfilt_size = (nvb << mi_high_l2[pli]);
    const int ysize =
        vfilt_size + CDEF_VBORDER * (!is_fb_on_frm_bottom_boundary) + yoff;
    const int xsize =
        hfilt_size + CDEF_HBORDER * (!is_fb_on_frm_right_boundary) + xoff;
    const int row = fbr * MI_SIZE_64X64 << mi_high_l2[pli];
    const int col = fbc * MI_SIZE_64X64 << mi_wide_l2[pli];
    struct macroblockd_plane pd = cdef_search_ctx->plane[pli];
    cdef_search_ctx->copy_fn(&in[(-yoff * CDEF_BSTRIDE - xoff)], CDEF_BSTRIDE,
                             pd.dst.buf, row - yoff, col - xoff, pd.dst.stride,
                             ysize, xsize);
    fill_borders_for_fbs_on_frame_boundary(
        inbuf, hfilt_size, vfilt_size, is_fb_on_frm_left_boundary,
        is_fb_on_frm_right_boundary, is_fb_on_frm_top_boundary,
        is_fb_on_frm_bottom_boundary);
    for (int gi = 0; gi < cdef_search_ctx->total_strengths; gi++) {
      int pri_strength, sec_strength;
      get_cdef_filter_strengths(cdef_search_ctx->pick_method, &pri_strength,
                                &sec_strength, gi);
      const uint64_t curr_mse = get_filt_error(
          cdef_search_ctx, &pd, dlist, dir, &dirinit, var, in, ref_buffer[pli],
          ref_stride[pli], row, col, pri_strength, sec_strength, cdef_count,
          pli, coeff_shift, bs);
      if (pli < 2)
        cdef_search_ctx->mse[pli][sb_count][gi] = curr_mse;
      else
        cdef_search_ctx->mse[1][sb_count][gi] += curr_mse;
    }
  }
  cdef_search_ctx->sb_index[sb_count] =
      MI_SIZE_64X64 * fbr * mi_params->mi_stride + MI_SIZE_64X64 * fbc;
}